

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O3

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::UBOBindingNegativeCase::generateShaders
          (UBOBindingNegativeCase *this)

{
  char *pcVar1;
  ShaderType SVar2;
  uint uVar3;
  ostream *poVar4;
  ShaderProgram *this_00;
  uint uVar5;
  uint uVar6;
  undefined8 uVar7;
  char *pcVar8;
  _Alloc_hider _Var9;
  string *name;
  long lVar10;
  int declNdx;
  ulong uVar11;
  string uname;
  ProgramSources sources;
  ostringstream shaderBody;
  ostringstream tessEvalUniformDecl;
  ostringstream tessCtrlUniformDecl;
  ostringstream fragmentUniformDecl;
  ostringstream vertexUniformDecl;
  undefined4 local_bf0;
  undefined4 uStack_bec;
  value_type local_be8;
  uint local_bc4;
  string local_bc0;
  string local_ba0;
  string local_b80;
  string local_b60;
  string local_b40;
  undefined1 local_b20 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b10;
  undefined1 local_af8 [16];
  undefined1 local_ae8 [128];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> vStack_a68;
  deUint32 local_a50;
  undefined1 local_a48 [24];
  undefined1 local_a30;
  string local_a28;
  string local_a08;
  string local_9e8;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  string local_948;
  ulong local_928;
  string local_920;
  undefined1 local_900 [96];
  undefined1 auStack_8a0 [48];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> vStack_870;
  deUint32 local_858;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_850;
  bool local_838;
  ostringstream local_788 [112];
  ios_base local_718 [264];
  ostringstream local_610 [112];
  ios_base local_5a0 [264];
  ostringstream local_498 [112];
  ios_base local_428 [264];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__cxx11::ostringstream::ostringstream(local_498);
  std::__cxx11::ostringstream::ostringstream(local_610);
  std::__cxx11::ostringstream::ostringstream(local_788);
  uVar6 = (this->super_LayoutBindingNegativeCase).m_numBindings;
  uVar5 = (this->super_LayoutBindingNegativeCase).m_testType - TESTTYPE_BINDING_ARRAY;
  uVar3 = 1;
  if (1 < uVar5) {
    uVar3 = uVar6;
  }
  if (0 < (int)uVar3) {
    name = &(this->super_LayoutBindingNegativeCase).m_uniformName;
    local_928 = (ulong)uVar3;
    uVar11 = 0;
    local_bc4 = uVar5;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(std140, binding = ",0x19);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (local_1a8,
                          (this->super_LayoutBindingNegativeCase).m_vertexShaderBinding.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") uniform ",10);
      declNdx = (int)uVar11;
      getUniformName((string *)local_900,name,declNdx);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_900._0_8_,local_900._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\thighp vec4 color1;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\thighp vec4 color2;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} ",2);
      if (uVar5 < 2) {
        local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_948,"colors","");
        getUniformName((string *)local_af8,&local_948,declNdx,
                       (this->super_LayoutBindingNegativeCase).m_numBindings);
        uVar5 = local_bc4;
      }
      else {
        local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_968,"colors","");
        getUniformName((string *)local_af8,&local_968,declNdx);
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)CONCAT44(local_af8._4_4_,local_af8._0_4_),local_af8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
      if ((undefined1 *)CONCAT44(local_af8._4_4_,local_af8._0_4_) != local_ae8) {
        operator_delete((undefined1 *)CONCAT44(local_af8._4_4_,local_af8._0_4_),local_ae8._0_8_ + 1)
        ;
      }
      if (uVar5 < 2) {
        uVar7 = local_948.field_2._M_allocated_capacity;
        _Var9._M_p = local_948._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_948._M_dataplus._M_p != &local_948.field_2) {
LAB_00421dfe:
          operator_delete(_Var9._M_p,uVar7 + 1);
        }
      }
      else {
        uVar7 = local_968.field_2._M_allocated_capacity;
        _Var9._M_p = local_968._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_968._M_dataplus._M_p != &local_968.field_2) goto LAB_00421dfe;
      }
      if ((undefined1 *)local_900._0_8_ != local_900 + 0x10) {
        operator_delete((void *)local_900._0_8_,local_900._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"layout(std140, binding = ",0x19);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (local_320,
                          (this->super_LayoutBindingNegativeCase).m_fragmentShaderBinding.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") uniform ",10);
      getUniformName((string *)local_900,name,declNdx);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_900._0_8_,local_900._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\thighp vec4 color1;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\thighp vec4 color2;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} ",2);
      if (uVar5 < 2) {
        local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_988,"colors","");
        getUniformName((string *)local_af8,&local_988,declNdx,
                       (this->super_LayoutBindingNegativeCase).m_numBindings);
      }
      else {
        local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a8,"colors","");
        getUniformName((string *)local_af8,&local_9a8,declNdx);
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)CONCAT44(local_af8._4_4_,local_af8._0_4_),local_af8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
      if ((undefined1 *)CONCAT44(local_af8._4_4_,local_af8._0_4_) != local_ae8) {
        operator_delete((undefined1 *)CONCAT44(local_af8._4_4_,local_af8._0_4_),local_ae8._0_8_ + 1)
        ;
      }
      if (uVar5 < 2) {
        uVar7 = local_988.field_2._M_allocated_capacity;
        _Var9._M_p = local_988._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_988._M_dataplus._M_p != &local_988.field_2) {
LAB_0042202a:
          operator_delete(_Var9._M_p,uVar7 + 1);
        }
      }
      else {
        uVar7 = local_9a8.field_2._M_allocated_capacity;
        _Var9._M_p = local_9a8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) goto LAB_0042202a;
      }
      if ((undefined1 *)local_900._0_8_ != local_900 + 0x10) {
        operator_delete((void *)local_900._0_8_,local_900._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_498,"layout(std140, binding = ",0x19);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (local_498,
                          (this->super_LayoutBindingNegativeCase).m_tessCtrlShaderBinding.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") uniform ",10);
      getUniformName((string *)local_900,name,declNdx);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_900._0_8_,local_900._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\thighp vec4 color1;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\thighp vec4 color2;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} ",2);
      if (uVar5 < 2) {
        local_9c8._M_dataplus._M_p = (pointer)&local_9c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c8,"colors","");
        getUniformName((string *)local_af8,&local_9c8,declNdx,
                       (this->super_LayoutBindingNegativeCase).m_numBindings);
      }
      else {
        local_9e8._M_dataplus._M_p = (pointer)&local_9e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e8,"colors","");
        getUniformName((string *)local_af8,&local_9e8,declNdx);
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)CONCAT44(local_af8._4_4_,local_af8._0_4_),local_af8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
      if ((undefined1 *)CONCAT44(local_af8._4_4_,local_af8._0_4_) != local_ae8) {
        operator_delete((undefined1 *)CONCAT44(local_af8._4_4_,local_af8._0_4_),local_ae8._0_8_ + 1)
        ;
      }
      if (uVar5 < 2) {
        uVar7 = local_9c8.field_2._M_allocated_capacity;
        _Var9._M_p = local_9c8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
LAB_00422256:
          operator_delete(_Var9._M_p,uVar7 + 1);
        }
      }
      else {
        uVar7 = local_9e8.field_2._M_allocated_capacity;
        _Var9._M_p = local_9e8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9e8._M_dataplus._M_p != &local_9e8.field_2) goto LAB_00422256;
      }
      if ((undefined1 *)local_900._0_8_ != local_900 + 0x10) {
        operator_delete((void *)local_900._0_8_,local_900._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_610,"layout(std140, binding = ",0x19);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (local_610,
                          (this->super_LayoutBindingNegativeCase).m_tessCtrlShaderBinding.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") uniform ",10);
      getUniformName((string *)local_900,name,declNdx);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_900._0_8_,local_900._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\thighp vec4 color1;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\thighp vec4 color2;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} ",2);
      if (uVar5 < 2) {
        local_a08._M_dataplus._M_p = (pointer)&local_a08.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a08,"colors","");
        getUniformName((string *)local_af8,&local_a08,declNdx,
                       (this->super_LayoutBindingNegativeCase).m_numBindings);
      }
      else {
        local_a28._M_dataplus._M_p = (pointer)&local_a28.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a28,"colors","");
        getUniformName((string *)local_af8,&local_a28,declNdx);
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)CONCAT44(local_af8._4_4_,local_af8._0_4_),local_af8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
      if ((undefined1 *)CONCAT44(local_af8._4_4_,local_af8._0_4_) != local_ae8) {
        operator_delete((undefined1 *)CONCAT44(local_af8._4_4_,local_af8._0_4_),local_ae8._0_8_ + 1)
        ;
      }
      if (uVar5 < 2) {
        uVar7 = local_a08.field_2._M_allocated_capacity;
        _Var9._M_p = local_a08._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
LAB_00422482:
          operator_delete(_Var9._M_p,uVar7 + 1);
        }
      }
      else {
        uVar7 = local_a28.field_2._M_allocated_capacity;
        _Var9._M_p = local_a28._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a28._M_dataplus._M_p != &local_a28.field_2) goto LAB_00422482;
      }
      if ((undefined1 *)local_900._0_8_ != local_900 + 0x10) {
        operator_delete((void *)local_900._0_8_,local_900._16_8_ + 1);
      }
      uVar11 = uVar11 + 1;
    } while (local_928 != uVar11);
    uVar6 = (this->super_LayoutBindingNegativeCase).m_numBindings;
  }
  if (0 < (int)(uVar6 * 2)) {
    pcVar1 = local_900 + 0x10;
    uVar6 = 0;
    do {
      local_900._0_8_ = pcVar1;
      if (uVar5 < 2) {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_900,"colors","");
        getUniformName((string *)local_af8,(string *)local_900,0,uVar6 >> 1);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_900,"colors","");
        getUniformName((string *)local_af8,(string *)local_900,uVar6 >> 1);
      }
      if ((char *)local_900._0_8_ != pcVar1) {
        operator_delete((void *)local_900._0_8_,local_900._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"\t",1);
      pcVar8 = "else if";
      if (uVar6 == 0) {
        pcVar8 = "if";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_788,pcVar8,(ulong)(uVar6 != 0) * 5 + 2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_788," (u_arrayNdx == ",0x10);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_900);
      std::ostream::operator<<((string *)local_900,uVar6);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_900);
      std::ios_base::~ios_base((ios_base *)(auStack_8a0 + 0x10));
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_788,(char *)CONCAT44(uStack_bec,local_bf0),
                          (long)local_be8._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t{\n",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\tcolor = ",10);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)CONCAT44(local_af8._4_4_,local_af8._0_4_),local_af8._8_8_);
      pcVar8 = ".color2";
      if ((uVar6 & 1) == 0) {
        pcVar8 = ".color1";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t}\n",3);
      if ((size_type *)CONCAT44(uStack_bec,local_bf0) != &local_be8._M_string_length) {
        operator_delete((undefined1 *)CONCAT44(uStack_bec,local_bf0),local_be8._M_string_length + 1)
        ;
      }
      if ((undefined1 *)CONCAT44(local_af8._4_4_,local_af8._0_4_) != local_ae8) {
        operator_delete((undefined1 *)CONCAT44(local_af8._4_4_,local_af8._0_4_),local_ae8._0_8_ + 1)
        ;
      }
      uVar6 = uVar6 + 1;
    } while ((int)uVar6 < (this->super_LayoutBindingNegativeCase).m_numBindings * 2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"\telse\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_788,"\t\tcolor = vec4(0.0, 0.0, 0.0, 1.0);\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"\t}\n",3);
  memset(local_af8,0,0xac);
  local_a48._0_8_ = (pointer)0x0;
  local_a48[8] = 0;
  local_a48._9_7_ = 0;
  local_a48[0x10] = 0;
  stack0xfffffffffffff5c9 = 0;
  SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateVertexShader(&local_ba0,SVar2,&local_b80,&local_b60);
  local_be8._M_dataplus._M_p = (pointer)&local_be8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_be8,local_ba0._M_dataplus._M_p,
             local_ba0._M_dataplus._M_p + local_ba0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_af8,&local_be8);
  SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateFragmentShader(&local_bc0,SVar2,&local_b40,&local_920);
  local_b20._0_4_ = 1;
  local_b20._8_8_ = local_b10._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_b20 + 8),local_bc0._M_dataplus._M_p,
             local_bc0._M_dataplus._M_p + local_bc0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_af8 + (ulong)(uint)local_b20._0_4_ * 0x18),(value_type *)(local_b20 + 8));
  lVar10 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_900 + lVar10),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_af8 + lVar10));
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&vStack_870,&vStack_a68);
  local_858 = local_a50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_850,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a48);
  local_838 = (bool)local_a30;
  if ((char *)local_b20._8_8_ != local_b10._M_local_buf + 8) {
    operator_delete((void *)local_b20._8_8_,local_b10._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
    operator_delete(local_bc0._M_dataplus._M_p,local_bc0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920._M_dataplus._M_p != &local_920.field_2) {
    operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
    operator_delete(local_b40._M_dataplus._M_p,local_b40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be8._M_dataplus._M_p != &local_be8.field_2) {
    operator_delete(local_be8._M_dataplus._M_p,local_be8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba0._M_dataplus._M_p != &local_ba0.field_2) {
    operator_delete(local_ba0._M_dataplus._M_p,local_ba0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b60._M_dataplus._M_p != &local_b60.field_2) {
    operator_delete(local_b60._M_dataplus._M_p,local_b60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
    operator_delete(local_b80._M_dataplus._M_p,local_b80.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a48);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&vStack_a68);
  lVar10 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_af8 + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  if ((this->super_LayoutBindingNegativeCase).m_tessSupport == true) {
    SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    generateTessControlShader((string *)local_b20,SVar2,&local_ba0,&local_b80);
    local_af8._0_4_ = 3;
    local_af8._8_8_ = local_ae8 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_af8 + 8),CONCAT44(local_b20._4_4_,local_b20._0_4_),
               (char *)(local_b20._8_8_ + CONCAT44(local_b20._4_4_,local_b20._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_900 + (ulong)(uint)local_af8._0_4_ * 0x18),(value_type *)(local_af8 + 8));
    SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    generateTessEvaluationShader(&local_b60,SVar2,&local_bc0,&local_b40);
    local_be8._M_dataplus._M_p = (pointer)&local_be8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_be8,local_b60._M_dataplus._M_p,
               local_b60._M_dataplus._M_p + local_b60._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_8a0,&local_be8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_be8._M_dataplus._M_p != &local_be8.field_2) {
      operator_delete(local_be8._M_dataplus._M_p,local_be8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b60._M_dataplus._M_p != &local_b60.field_2) {
      operator_delete(local_b60._M_dataplus._M_p,local_b60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
      operator_delete(local_b40._M_dataplus._M_p,local_b40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
      operator_delete(local_bc0._M_dataplus._M_p,local_bc0.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_af8._8_8_ != (pointer)(local_ae8 + 8)) {
      operator_delete((void *)local_af8._8_8_,local_ae8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_b20._4_4_,local_b20._0_4_) != &local_b10) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_b20._4_4_,local_b20._0_4_),
                      local_b10._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
      operator_delete(local_b80._M_dataplus._M_p,local_b80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ba0._M_dataplus._M_p != &local_ba0.field_2) {
      operator_delete(local_ba0._M_dataplus._M_p,local_ba0.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram
            (this_00,((this->super_LayoutBindingNegativeCase).super_TestCase.m_context)->m_renderCtx
             ,(ProgramSources *)local_900);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_850);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&vStack_870);
  lVar10 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_900 + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  std::__cxx11::ostringstream::~ostringstream(local_788);
  std::ios_base::~ios_base(local_718);
  std::__cxx11::ostringstream::~ostringstream(local_610);
  std::ios_base::~ios_base(local_5a0);
  std::__cxx11::ostringstream::~ostringstream(local_498);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return this_00;
}

Assistant:

glu::ShaderProgram* UBOBindingNegativeCase::generateShaders (void) const
{
	std::ostringstream		vertexUniformDecl;
	std::ostringstream		fragmentUniformDecl;
	std::ostringstream		tessCtrlUniformDecl;
	std::ostringstream		tessEvalUniformDecl;
	std::ostringstream		shaderBody;
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	const int				numDeclarations = (arrayInstance ? 1 : m_numBindings);

	// Generate the uniform declarations for the vertex and fragment shaders
	for (int declNdx = 0; declNdx < numDeclarations; ++declNdx)
	{
		vertexUniformDecl << "layout(std140, binding = " << m_vertexShaderBinding[declNdx] << ") uniform "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";

		fragmentUniformDecl << "layout(std140, binding = " << m_fragmentShaderBinding[declNdx] << ") uniform "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";

		tessCtrlUniformDecl << "layout(std140, binding = " << m_tessCtrlShaderBinding[declNdx] << ") uniform "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";

		tessEvalUniformDecl << "layout(std140, binding = " << m_tessCtrlShaderBinding[declNdx] << ") uniform "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";
	}

	// Generate the shader body for the vertex and fragment shaders
	for (int bindNdx = 0; bindNdx < m_numBindings*2; ++bindNdx)	// Multiply by two to cover cases for both colors for each UBO
	{
		const std::string uname = (arrayInstance ? getUniformName("colors", 0, bindNdx/2) : getUniformName("colors", bindNdx/2));
		shaderBody	<< "	" << (bindNdx == 0 ? "if" : "else if") << " (u_arrayNdx == " << de::toString(bindNdx) << ")\n"
					<< "	{\n"
					<< "		color = " << uname << (bindNdx%2 == 0 ? ".color1" : ".color2") << ";\n"
					<< "	}\n";
	}

	shaderBody	<< "	else\n"
				<< "	{\n"
				<< "		color = vec4(0.0, 0.0, 0.0, 1.0);\n"
				<< "	}\n";

	glu::ProgramSources sources = glu::ProgramSources()
				<< glu::VertexSource(generateVertexShader(m_shaderType, vertexUniformDecl.str(), shaderBody.str()))
				<< glu::FragmentSource(generateFragmentShader(m_shaderType, fragmentUniformDecl.str(), shaderBody.str()));

	if (m_tessSupport)
		sources << glu::TessellationControlSource(generateTessControlShader(m_shaderType, tessCtrlUniformDecl.str(), shaderBody.str()))
				<< glu::TessellationEvaluationSource(generateTessEvaluationShader(m_shaderType, tessEvalUniformDecl.str(), shaderBody.str()));

	return new glu::ShaderProgram(m_context.getRenderContext(), sources);
}